

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O0

extent_float_t __thiscall
ear::PolarExtentCoreScalar::weight_stadium
          (PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx,ExtentPosition *position)

{
  int __x;
  float extraout_XMM0_Da;
  extent_float_t sin_angle;
  ExtentPosition EVar1;
  extent_float_t circle_dot;
  bool in_straight_line_part;
  extent_float_t circle_test_dot;
  ExtentPosition position_t_right;
  ExtentPosition position_t;
  ExtentPosition *position_local;
  PolarExtentCoreContext *ctx_local;
  PolarExtentCoreScalar *this_local;
  
  EVar1 = ExtentPosition::transform(position,ctx->flippedBasis);
  __x = (int)position;
  std::abs(__x);
  circle_test_dot = EVar1.y;
  if (extraout_XMM0_Da * ctx->circle_test[0] + circle_test_dot * ctx->circle_test[1] < 0.0) {
    this_local._4_4_ =
         weight_from_cos(this,ctx,extraout_XMM0_Da * ctx->right_circle_centre[0] +
                                  circle_test_dot * ctx->right_circle_centre[1]);
  }
  else {
    std::abs(__x);
    this_local._4_4_ = weight_from_sin(this,ctx,sin_angle);
  }
  return this_local._4_4_;
}

Assistant:

extent_float_t weight_stadium(PolarExtentCoreContext &ctx,
                                  const ExtentPosition &position) const {
      ExtentPosition position_t = position.transform(ctx.flippedBasis);

      ExtentPosition position_t_right = position_t;
      position_t_right.x = std::abs(position_t.x);

      auto circle_test_dot = position_t_right.x * ctx.circle_test[0] +
                             position_t_right.y * ctx.circle_test[1];
      bool in_straight_line_part = circle_test_dot >= 0.0;

      if (in_straight_line_part)
        return weight_from_sin(ctx, std::abs(position_t.z));
      else {
        auto circle_dot = position_t_right.x * ctx.right_circle_centre[0] +
                          position_t_right.y * ctx.right_circle_centre[1];
        return weight_from_cos(ctx, circle_dot);
      }
    }